

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86::forward
          (DeconvolutionDepthWise_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int i_00;
  int i_01;
  uint uVar1;
  pointer pMVar2;
  pointer pMVar3;
  int *piVar4;
  long *plVar5;
  Option *pOVar6;
  int i_02;
  int iVar7;
  Layer *pLVar8;
  uint uVar9;
  void *pvVar10;
  void *pvVar11;
  int k;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int i;
  ulong uVar20;
  void *pvVar21;
  int iVar22;
  ulong uVar23;
  ParamDict pd;
  Mat local_1f8;
  Mat local_1a8;
  pointer local_160;
  pointer local_158;
  Option *local_150;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_148;
  void *local_140;
  ulong local_138;
  void *local_130;
  ModelBinFromMatArray local_128;
  Mat local_118;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  int local_68;
  Allocator *local_60;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  size_t local_40;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  i_00 = pMVar2[1].w;
  iVar22 = pMVar2->elempack * pMVar2->c;
  i_01 = pMVar2[1].h;
  i_02 = (this->super_DeconvolutionDepthWise).group * pMVar2[1].d;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_148 = bottom_blobs;
  flatten(pMVar2 + 1,&local_118,opt);
  iVar7 = -100;
  local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
  local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if ((local_118.data == (void *)0x0) ||
     (local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize),
     local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_118.c * local_118.cstep == 0)) goto LAB_003e5f5c;
  local_118.w = local_118.w * local_118.elempack;
  local_118.elemsize =
       CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) /
       (ulong)(long)local_118.elempack;
  local_118.elempack = 1;
  local_1a8.cstep = 0;
  uVar18 = i_01 * i_00;
  local_1a8.data = (void *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elemsize._4_4_ = 0;
  local_1a8.elempack = 0;
  local_1a8.allocator = (Allocator *)0x0;
  local_1a8.dims = 0;
  local_1a8.w = 0;
  local_1a8.h = 0;
  local_1a8.d = 0;
  local_1a8.c = 0;
  local_160 = pMVar3;
  local_158 = pMVar2;
  local_150 = opt;
  Mat::create(&local_1a8,(int)(uVar18 * iVar22 * i_02) / (this->super_DeconvolutionDepthWise).group,
              4,opt->workspace_allocator);
  pOVar6 = local_150;
  pMVar3 = local_158;
  pMVar2 = local_160;
  iVar7 = -100;
  local_130 = local_1a8.data;
  local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if ((local_1a8.data != (void *)0x0) &&
     (local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_1a8.c * local_1a8.cstep != 0)) {
    uVar1 = (this->super_DeconvolutionDepthWise).group;
    uVar9 = i_02 / (int)uVar1;
    uVar23 = (long)iVar22 / (long)(int)uVar1;
    local_140 = local_118.data;
    uVar20 = 0;
    uVar15 = 0;
    if (0 < (int)uVar18) {
      uVar15 = (ulong)uVar18;
    }
    lVar16 = (long)(int)uVar18;
    iVar7 = (int)uVar23;
    uVar17 = 0;
    if (0 < iVar7) {
      uVar17 = uVar23 & 0xffffffff;
    }
    uVar23 = 0;
    if (0 < (int)uVar9) {
      uVar23 = (ulong)uVar9;
    }
    local_138 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      local_138 = uVar20;
    }
    for (uVar19 = 0; uVar19 != local_138; uVar19 = uVar19 + 1) {
      iVar22 = (int)uVar20;
      pvVar10 = (void *)((long)local_1a8.data + (long)iVar22 * 4);
      pvVar13 = (void *)((long)local_118.data + (long)iVar22 * 4);
      for (uVar20 = 0; uVar20 != uVar23; uVar20 = uVar20 + 1) {
        pvVar11 = pvVar10;
        pvVar21 = pvVar13;
        for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            *(undefined4 *)((long)pvVar11 + uVar12 * 4) =
                 *(undefined4 *)((long)pvVar21 + uVar12 * 4);
          }
          pvVar11 = (void *)((long)pvVar11 + lVar16 * 4);
          pvVar21 = (void *)((long)pvVar21 + (int)uVar9 * lVar16 * 4);
        }
        pvVar10 = (void *)((long)pvVar10 + iVar7 * lVar16 * 4);
        pvVar13 = (void *)((long)pvVar13 + lVar16 * 4);
      }
      uVar20 = (ulong)(iVar22 + iVar7 * uVar18 * uVar9);
    }
    local_1f8.cstep = 0;
    local_1f8.data = (void *)0x0;
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = 0;
    local_1f8.elemsize._4_4_ = 0;
    local_1f8.elemsize = 0;
    local_1f8.elempack = 0;
    local_1f8.allocator = (Allocator *)0x0;
    local_1f8.dims = 0;
    local_1f8.w = 0;
    local_1f8.h = 0;
    local_1f8.d = 0;
    local_1f8.c = 0;
    if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
LAB_003e5afa:
      pLVar8 = create_layer_cpu(0x33);
      ParamDict::ParamDict(&pd);
      ParamDict::set(&pd,0,i_02);
      ParamDict::set(&pd,1,i_00);
      ParamDict::set(&pd,0xb,i_01);
      ParamDict::set(&pd,2,(this->super_DeconvolutionDepthWise).dilation_w);
      ParamDict::set(&pd,0xc,(this->super_DeconvolutionDepthWise).dilation_h);
      ParamDict::set(&pd,3,(this->super_DeconvolutionDepthWise).stride_w);
      ParamDict::set(&pd,0xd,(this->super_DeconvolutionDepthWise).stride_h);
      ParamDict::set(&pd,4,(this->super_DeconvolutionDepthWise).pad_left);
      ParamDict::set(&pd,0xf,(this->super_DeconvolutionDepthWise).pad_right);
      ParamDict::set(&pd,0xe,(this->super_DeconvolutionDepthWise).pad_top);
      ParamDict::set(&pd,0x10,(this->super_DeconvolutionDepthWise).pad_bottom);
      ParamDict::set(&pd,0x12,(this->super_DeconvolutionDepthWise).output_pad_right);
      ParamDict::set(&pd,0x13,(this->super_DeconvolutionDepthWise).output_pad_bottom);
      ParamDict::set(&pd,0x14,(this->super_DeconvolutionDepthWise).output_w);
      ParamDict::set(&pd,0x15,(this->super_DeconvolutionDepthWise).output_h);
      ParamDict::set(&pd,5,(this->super_DeconvolutionDepthWise).bias_term);
      ParamDict::set(&pd,6,local_1a8.w);
      ParamDict::set(&pd,7,(this->super_DeconvolutionDepthWise).group);
      ParamDict::set(&pd,9,(this->super_DeconvolutionDepthWise).activation_type);
      ParamDict::set(&pd,10,&(this->super_DeconvolutionDepthWise).activation_params);
      (*pLVar8->_vptr_Layer[2])(pLVar8,&pd);
      piVar4 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      piVar4 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      local_c8.cstep = local_1a8.cstep;
      local_c8.d = local_1a8.d;
      local_c8.c = local_1a8.c;
      local_c8.h = local_1a8.h;
      local_c8.w = local_1a8.w;
      local_c8.dims = local_1a8.dims;
      local_c8.allocator = local_1a8.allocator;
      local_c8.elempack = local_1a8.elempack;
      local_c8.elemsize._4_4_ = local_1a8.elemsize._4_4_;
      local_c8.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_c8.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_c8.refcount._0_4_ = local_1a8.refcount._0_4_;
      local_c8.data = local_1a8.data;
      local_70 = local_1f8.elemsize;
      local_80 = local_1f8.data;
      uStack_78 = local_1f8.refcount._0_4_;
      uStack_74 = local_1f8.refcount._4_4_;
      local_68 = local_1f8.elempack;
      local_60 = local_1f8.allocator;
      iStack_58 = local_1f8.dims;
      iStack_54 = local_1f8.w;
      iStack_50 = local_1f8.h;
      iStack_4c = local_1f8.d;
      local_48 = local_1f8.c;
      local_40 = local_1f8.cstep;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_128,&local_c8);
      (*pLVar8->_vptr_Layer[3])(pLVar8,&local_128);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_128);
      (*pLVar8->_vptr_Layer[4])(pLVar8,pOVar6);
      (*pLVar8->_vptr_Layer[7])(pLVar8,pMVar3,pMVar2,pOVar6);
      (*pLVar8->_vptr_Layer[5])(pLVar8,pOVar6);
      (*pLVar8->_vptr_Layer[1])(pLVar8);
      lVar16 = 0x48;
      do {
        piVar4 = *(int **)((long)&local_c8.refcount + lVar16);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            plVar5 = *(long **)((long)&local_c8.allocator + lVar16);
            if (plVar5 == (long *)0x0) {
              free(*(void **)((long)&local_c8.data + lVar16));
            }
            else {
              (**(code **)(*plVar5 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_c8.cstep + lVar16) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar16 + 4) = 0;
        *(undefined8 *)((long)&local_c8.elemsize + lVar16 + 4) = 0;
        *(undefined8 *)((long)&local_c8.data + lVar16) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar16) = 0;
        *(undefined4 *)((long)&local_c8.c + lVar16) = 0;
        *(undefined8 *)((long)&local_c8.dims + lVar16) = 0;
        *(undefined8 *)((long)&local_c8.h + lVar16) = 0;
        lVar16 = lVar16 + -0x48;
      } while (lVar16 != -0x48);
      ParamDict::~ParamDict(&pd);
      iVar7 = 0;
    }
    else {
      flatten((local_148->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_1f8,local_150);
      iVar7 = -100;
      local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
      local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
      if ((local_1f8.data != (void *)0x0) &&
         (local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize),
         local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
         (long)local_1f8.c * local_1f8.cstep != 0)) {
        local_1f8.w = local_1f8.w * local_1f8.elempack;
        local_1f8.elemsize =
             CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize) /
             (ulong)(long)local_1f8.elempack;
        local_1f8.elempack = 1;
        goto LAB_003e5afa;
      }
    }
    piVar4 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          free(local_1f8.data);
        }
        else {
          (*(local_1f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar4 = (int *)CONCAT44(local_1a8.refcount._4_4_,local_1a8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        free(local_1a8.data);
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003e5f5c:
  piVar4 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int DeconvolutionDepthWise_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c * bottom_blob.elempack;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::DeconvolutionDepthWise);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, output_pad_right);
    pd.set(19, output_pad_bottom);
    pd.set(20, output_w);
    pd.set(21, output_h);
    pd.set(5, bias_term);
    pd.set(6, weight_data_transposed.w);
    pd.set(7, group);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_transposed;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}